

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O3

Status __thiscall leveldb::VersionSet::Recover(VersionSet *this,bool *save_manifest)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Env *env;
  pointer pcVar2;
  ulong uVar3;
  Status SVar4;
  VersionSet *this_00;
  _Alloc_hider _Var5;
  bool bVar6;
  int iVar7;
  long *plVar8;
  undefined4 extraout_var;
  Version *v;
  size_type *psVar9;
  ulong uVar10;
  undefined1 *in_RDX;
  byte bVar11;
  ulong uVar12;
  byte bVar13;
  VersionSet *pVVar14;
  byte bVar15;
  byte bVar16;
  SequentialFile *file;
  string scratch;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string current;
  string dscname;
  Slice record;
  LogReporter reporter;
  VersionEdit edit;
  Reader reader;
  Builder builder;
  Status local_3d8;
  VersionSet *local_3d0;
  uint64_t local_3c8;
  SequentialFile *local_3c0;
  string local_3b8;
  undefined1 local_398 [64];
  string local_358;
  string local_338;
  VersionSet *local_318;
  undefined1 *local_310;
  Slice local_308;
  Slice local_2f8;
  Reporter local_2e8;
  undefined1 *local_2e0;
  Slice local_2d8;
  VersionEdit local_2c8;
  Reader local_220;
  undefined1 local_1c8 [408];
  
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  local_358._M_string_length = 0;
  local_358.field_2._M_local_buf[0] = '\0';
  env = *(Env **)save_manifest;
  local_3d0 = (VersionSet *)save_manifest;
  CurrentFileName((string *)local_1c8,(string *)(save_manifest + 8));
  ReadFileToString((leveldb *)&local_3d8,env,(string *)local_1c8,&local_358);
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_1c8 + 0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._0_8_ != paVar1) {
    operator_delete((void *)local_1c8._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8.state_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    this->env_ = (Env *)local_3d8.state_;
    goto LAB_001163cf;
  }
  if (((pointer)local_358._M_string_length == (pointer)0x0) ||
     ((local_358._M_dataplus._M_p + -1)[local_358._M_string_length] != '\n')) {
    local_1c8._0_8_ = "CURRENT file does not end with newline";
    local_1c8._8_8_ = (Version *)0x26;
    local_2c8.comparator_._M_dataplus._M_p = "";
    local_2c8.comparator_._M_string_length = 0;
    Status::Status((Status *)this,kCorruption,(Slice *)local_1c8,(Slice *)&local_2c8);
  }
  else {
    std::__cxx11::string::resize((ulong)&local_358,(char)local_358._M_string_length + -1);
    pcVar2 = (local_3d0->dbname_)._M_dataplus._M_p;
    local_1c8._0_8_ = paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1c8,pcVar2,pcVar2 + (local_3d0->dbname_)._M_string_length);
    std::__cxx11::string::append(local_1c8);
    local_310 = in_RDX;
    plVar8 = (long *)std::__cxx11::string::_M_append(local_1c8,(ulong)local_358._M_dataplus._M_p);
    local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
    psVar9 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_338.field_2._M_allocated_capacity = *psVar9;
      local_338.field_2._8_8_ = plVar8[3];
    }
    else {
      local_338.field_2._M_allocated_capacity = *psVar9;
      local_338._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_338._M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._0_8_ != paVar1) {
      operator_delete((void *)local_1c8._0_8_);
    }
    (*local_3d0->env_->_vptr_Env[2])(local_1c8,local_3d0->env_,&local_338,&local_3c0);
    SVar4.state_ = local_3d8.state_;
    local_3d8.state_ = (char *)local_1c8._0_8_;
    local_1c8._0_8_ = SVar4.state_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)SVar4.state_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete__(SVar4.state_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8.state_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      Builder::Builder((Builder *)local_1c8,local_3d0,local_3d0->current_);
      local_2e8._vptr_Reporter = (_func_int **)&PTR__Reporter_001352f0;
      local_318 = this;
      local_2e0 = (undefined1 *)&local_3d8;
      log::Reader::Reader(&local_220,local_3c0,&local_2e8,true,0);
      local_2f8.data_ = "";
      bVar16 = 0;
      local_2f8.size_ = 0;
      local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
      local_3b8._M_string_length = 0;
      local_3b8.field_2._M_local_buf[0] = '\0';
      bVar13 = 0;
      bVar15 = 0;
      bVar11 = 0;
      local_398._40_8_ = 0;
      local_398._32_8_ = 0;
      local_3c8 = 0;
      local_398._48_8_ = 0;
      while (bVar6 = log::Reader::ReadRecord(&local_220,&local_2f8,&local_3b8),
            bVar6 && (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_3d8.state_ ==
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0) {
        VersionEdit::VersionEdit(&local_2c8);
        VersionEdit::DecodeFrom((VersionEdit *)local_398,(Slice *)&local_2c8);
        SVar4.state_ = local_3d8.state_;
        local_3d8.state_ = (char *)local_398._0_8_;
        local_398._0_8_ = SVar4.state_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)SVar4.state_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete__(SVar4.state_);
        }
        if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_3d8.state_ ==
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0) && (local_2c8.has_comparator_ == true)) {
          (*((local_3d0->icmp_).user_comparator_)->_vptr_Comparator[3])();
          iVar7 = std::__cxx11::string::compare((char *)&local_2c8);
          if (iVar7 != 0) {
            local_398._0_8_ = local_398 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_398,local_2c8.comparator_._M_dataplus._M_p,
                       local_2c8.comparator_._M_dataplus._M_p +
                       local_2c8.comparator_._M_string_length);
            std::__cxx11::string::append((char *)local_398);
            local_2d8.data_._0_4_ = local_398._0_4_;
            local_2d8.data_._4_4_ = local_398._4_4_;
            local_2d8.size_._0_4_ = local_398._8_4_;
            local_2d8.size_._4_4_ = local_398._12_4_;
            iVar7 = (*((local_3d0->icmp_).user_comparator_)->_vptr_Comparator[3])();
            local_308.data_ = (char *)CONCAT44(extraout_var,iVar7);
            local_308.size_ = strlen(local_308.data_);
            Status::Status((Status *)(local_398 + 0x38),kInvalidArgument,&local_2d8,&local_308);
            SVar4.state_ = local_3d8.state_;
            local_3d8.state_ = (char *)local_398._56_8_;
            local_398._56_8_ = SVar4.state_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)SVar4.state_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              operator_delete__(SVar4.state_);
            }
            if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
              operator_delete((void *)local_398._0_8_);
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8.state_ ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          Builder::Apply((Builder *)local_1c8,&local_2c8);
        }
        if (local_2c8.has_log_number_ != false) {
          local_3c8 = local_2c8.log_number_;
        }
        if (local_2c8.has_prev_log_number_ != false) {
          local_398._48_8_ = local_2c8.prev_log_number_;
        }
        if (local_2c8.has_next_file_number_ != false) {
          local_398._40_8_ = local_2c8.next_file_number_;
        }
        if (local_2c8.has_last_sequence_ != false) {
          local_398._32_8_ = local_2c8.last_sequence_;
        }
        bVar16 = bVar16 | local_2c8.has_log_number_;
        bVar13 = bVar13 | local_2c8.has_prev_log_number_;
        bVar15 = bVar15 | local_2c8.has_next_file_number_;
        bVar11 = bVar11 | local_2c8.has_last_sequence_;
        VersionEdit::~VersionEdit(&local_2c8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
        operator_delete(local_3b8._M_dataplus._M_p);
      }
      log::Reader::~Reader(&local_220);
      log::Reader::Reporter::~Reporter(&local_2e8);
      if (local_3c0 != (SequentialFile *)0x0) {
        (*local_3c0->_vptr_SequentialFile[1])();
      }
      pVVar14 = local_3d0;
      local_3c0 = (SequentialFile *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d8.state_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        if ((bVar15 & 1) == 0) {
          local_2c8.comparator_._M_dataplus._M_p = "no meta-nextfile entry in descriptor";
          local_2c8.comparator_._M_string_length = 0x24;
          local_220.file_ = (SequentialFile *)0x123503;
          local_220.reporter_ = (Reporter *)0x0;
          Status::Status((Status *)&local_3b8,kCorruption,(Slice *)&local_2c8,(Slice *)&local_220);
          _Var5._M_p = local_3b8._M_dataplus._M_p;
          local_3b8._M_dataplus._M_p = local_3d8.state_;
          pVVar14 = local_3d0;
joined_r0x00116265:
          local_3d8.state_ = _Var5._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3b8._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete__(local_3b8._M_dataplus._M_p);
          }
        }
        else {
          if ((bVar16 & 1) == 0) {
            local_2c8.comparator_._M_dataplus._M_p = "no meta-lognumber entry in descriptor";
            local_2c8.comparator_._M_string_length = 0x25;
            local_220.file_ = (SequentialFile *)0x123503;
            local_220.reporter_ = (Reporter *)0x0;
            Status::Status((Status *)&local_3b8,kCorruption,(Slice *)&local_2c8,(Slice *)&local_220)
            ;
            _Var5._M_p = local_3b8._M_dataplus._M_p;
            local_3b8._M_dataplus._M_p = local_3d8.state_;
            goto joined_r0x00116265;
          }
          if ((bVar11 & 1) == 0) {
            local_2c8.comparator_._M_dataplus._M_p = "no last-sequence-number entry in descriptor";
            local_2c8.comparator_._M_string_length = 0x2b;
            local_220.file_ = (SequentialFile *)0x123503;
            local_220.reporter_ = (Reporter *)0x0;
            Status::Status((Status *)&local_3b8,kCorruption,(Slice *)&local_2c8,(Slice *)&local_220)
            ;
            _Var5._M_p = local_3b8._M_dataplus._M_p;
            local_3b8._M_dataplus._M_p = local_3d8.state_;
            goto joined_r0x00116265;
          }
        }
        uVar12 = 0;
        if ((bVar13 & 1) != 0) {
          uVar12 = local_398._48_8_;
        }
        uVar10 = pVVar14->next_file_number_;
        uVar3 = uVar12 + 1;
        if ((uVar10 <= uVar12) || (uVar3 = uVar10, uVar10 <= local_3c8)) {
          uVar10 = local_3c8 + 1;
          if (local_3c8 < uVar3) {
            uVar10 = uVar3;
          }
          pVVar14->next_file_number_ = uVar10;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8.state_ ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          v = (Version *)operator_new(0xe8);
          this_00 = local_3d0;
          v->vset_ = local_3d0;
          v->next_ = v;
          v->prev_ = v;
          v->refs_ = 0;
          memset(v->files_,0,0xb0);
          v->file_to_compact_level_ = -1;
          v->compaction_score_ = -1.0;
          v->compaction_level_ = -1;
          pVVar14 = (VersionSet *)local_1c8;
          Builder::SaveTo((Builder *)pVVar14,v);
          Finalize(pVVar14,v);
          AppendVersion(this_00,v);
          this_00->manifest_file_number_ = local_398._40_8_;
          this_00->next_file_number_ = local_398._40_8_ + 1;
          this_00->last_sequence_ = local_398._32_8_;
          this_00->log_number_ = local_3c8;
          this_00->prev_log_number_ = uVar12;
          bVar6 = ReuseManifest(this_00,&local_338,&local_358);
          if (!bVar6) {
            *local_310 = 1;
          }
        }
      }
      this = local_318;
      local_318->env_ = (Env *)local_3d8.state_;
      local_3d8.state_ = (char *)0x0;
      Builder::~Builder((Builder *)local_1c8);
    }
    else if (local_3d8.state_[4] == '\x01') {
      local_2c8.comparator_._M_dataplus._M_p = "CURRENT points to a non-existent file";
      local_2c8.comparator_._M_string_length = 0x25;
      Status::ToString_abi_cxx11_((string *)local_1c8,&local_3d8);
      local_220.file_ = (SequentialFile *)local_1c8._0_8_;
      local_220.reporter_ = (Reporter *)local_1c8._8_8_;
      Status::Status((Status *)this,kCorruption,(Slice *)&local_2c8,(Slice *)&local_220);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._0_8_ != paVar1) {
        operator_delete((void *)local_1c8._0_8_);
      }
    }
    else {
      this->env_ = (Env *)local_3d8.state_;
      local_3d8.state_ = (char *)0x0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != &local_338.field_2) {
      operator_delete(local_338._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8.state_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete__(local_3d8.state_);
  }
LAB_001163cf:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p);
  }
  return (Status)(char *)this;
}

Assistant:

Status VersionSet::Recover(bool* save_manifest) {
  struct LogReporter : public log::Reader::Reporter {
    Status* status;
    void Corruption(size_t bytes, const Status& s) override {
      if (this->status->ok()) *this->status = s;
    }
  };

  // Read "CURRENT" file, which contains a pointer to the current manifest file
  std::string current;
  Status s = ReadFileToString(env_, CurrentFileName(dbname_), &current);
  if (!s.ok()) {
    return s;
  }
  if (current.empty() || current[current.size() - 1] != '\n') {
    return Status::Corruption("CURRENT file does not end with newline");
  }
  current.resize(current.size() - 1);

  std::string dscname = dbname_ + "/" + current;
  SequentialFile* file;
  s = env_->NewSequentialFile(dscname, &file);
  if (!s.ok()) {
    if (s.IsNotFound()) {
      return Status::Corruption("CURRENT points to a non-existent file",
                                s.ToString());
    }
    return s;
  }

  bool have_log_number = false;
  bool have_prev_log_number = false;
  bool have_next_file = false;
  bool have_last_sequence = false;
  uint64_t next_file = 0;
  uint64_t last_sequence = 0;
  uint64_t log_number = 0;
  uint64_t prev_log_number = 0;
  Builder builder(this, current_);

  {
    LogReporter reporter;
    reporter.status = &s;
    log::Reader reader(file, &reporter, true /*checksum*/,
                       0 /*initial_offset*/);
    Slice record;
    std::string scratch;
    while (reader.ReadRecord(&record, &scratch) && s.ok()) {
      VersionEdit edit;
      s = edit.DecodeFrom(record);
      if (s.ok()) {
        if (edit.has_comparator_ &&
            edit.comparator_ != icmp_.user_comparator()->Name()) {
          s = Status::InvalidArgument(
              edit.comparator_ + " does not match existing comparator ",
              icmp_.user_comparator()->Name());
        }
      }

      if (s.ok()) {
        builder.Apply(&edit);
      }

      if (edit.has_log_number_) {
        log_number = edit.log_number_;
        have_log_number = true;
      }

      if (edit.has_prev_log_number_) {
        prev_log_number = edit.prev_log_number_;
        have_prev_log_number = true;
      }

      if (edit.has_next_file_number_) {
        next_file = edit.next_file_number_;
        have_next_file = true;
      }

      if (edit.has_last_sequence_) {
        last_sequence = edit.last_sequence_;
        have_last_sequence = true;
      }
    }
  }
  delete file;
  file = nullptr;

  if (s.ok()) {
    if (!have_next_file) {
      s = Status::Corruption("no meta-nextfile entry in descriptor");
    } else if (!have_log_number) {
      s = Status::Corruption("no meta-lognumber entry in descriptor");
    } else if (!have_last_sequence) {
      s = Status::Corruption("no last-sequence-number entry in descriptor");
    }

    if (!have_prev_log_number) {
      prev_log_number = 0;
    }

    MarkFileNumberUsed(prev_log_number);
    MarkFileNumberUsed(log_number);
  }

  if (s.ok()) {
    Version* v = new Version(this);
    builder.SaveTo(v);
    // Install recovered version
    Finalize(v);
    AppendVersion(v);
    manifest_file_number_ = next_file;
    next_file_number_ = next_file + 1;
    last_sequence_ = last_sequence;
    log_number_ = log_number;
    prev_log_number_ = prev_log_number;

    // See if we can reuse the existing MANIFEST file.
    if (ReuseManifest(dscname, current)) {
      // No need to save new manifest
    } else {
      *save_manifest = true;
    }
  }

  return s;
}